

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O3

void impl_GLSL_PushConstantArray(MOJOSHADER_glProgram *program,MOJOSHADER_uniform *u,GLfloat *f)

{
  GLint GVar1;
  PFNGLGETUNIFORMLOCATIONPROC *pp_Var2;
  
  pp_Var2 = &ctx->glGetUniformLocation;
  if (ctx->have_opengl_2 == 0) {
    pp_Var2 = (PFNGLGETUNIFORMLOCATIONPROC *)&ctx->glGetUniformLocationARB;
  }
  GVar1 = (**pp_Var2)(program->handle,u->name);
  if (-1 < GVar1) {
    (*ctx->glUniform4fv)(GVar1,u->array_count,f);
    return;
  }
  return;
}

Assistant:

static void impl_GLSL_PushConstantArray(MOJOSHADER_glProgram *program,
                                        const MOJOSHADER_uniform *u,
                                        const GLfloat *f)
{
    const GLint loc = glsl_uniform_loc(program, u->name);
    if (loc >= 0)   // not optimized out?
        ctx->glUniform4fv(loc, u->array_count, f);
}